

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  secp256k1_scalar sVar2;
  void *pvVar3;
  char *pcVar4;
  secp256k1_scalar s;
  int overflow;
  secp256k1_scalar e;
  secp256k1_fe rx;
  uchar buf [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  secp256k1_gej rj;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/main_impl.h"
            ,0xe6,"test condition failed: ctx != NULL");
    abort();
  }
  if (sig64 == (uchar *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "sig64 != NULL";
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (pubkey != (secp256k1_xonly_pubkey *)0x0) {
      iVar1 = secp256k1_fe_set_b32_limit(&rx,sig64);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&s,sig64 + 0x20,&overflow);
      if (overflow != 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&pk,(secp256k1_pubkey *)pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_get_b32(buf,&pk.x);
      secp256k1_schnorrsig_challenge(&e,sig64,msg,msglen,buf);
      sVar2 = 0xd - e;
      if (e == 0) {
        sVar2 = 0;
      }
      e = sVar2;
      secp256k1_gej_set_ge(&pkj,&pk);
      secp256k1_ecmult(&rj,&pkj,&e,&s);
      secp256k1_ge_set_gej_var(&r,&rj);
      iVar1 = secp256k1_ge_is_infinity(&r);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_fe_normalize_var(&r.y);
      iVar1 = secp256k1_fe_is_odd(&r.y);
      if (iVar1 == 0) {
        iVar1 = secp256k1_fe_equal_var(&rx,&r.x);
        return iVar1;
      }
      return 0;
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "pubkey != NULL";
  }
  else {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "msg != NULL || msglen == 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal_var(&rx, &r.x);
}